

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskROM.cpp
# Opt level: O3

void __thiscall MSX::DiskROM::run_for(DiskROM *this,HalfCycles half_cycles)

{
  undefined1 auVar1 [16];
  long lVar2;
  
  lVar2 = (long)half_cycles.super_WrappedInt<HalfCycles>.length_ * 800000 + this->controller_cycles_
  ;
  this->controller_cycles_ = lVar2;
  auVar1 = SEXT816(lVar2) * SEXT816(0x5dbd47d7de048bdf);
  WD::WD1770::run_for(&this->super_WD1770,
                      (Cycles)(long)((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)));
  this->controller_cycles_ = this->controller_cycles_ % 0xaec85;
  return;
}

Assistant:

void DiskROM::run_for(HalfCycles half_cycles) {
	// Input clock is going to be 7159090/2 Mhz, but the drive controller
	// needs an 8Mhz clock, so scale up. 8000000/7159090 simplifies to
	// 800000/715909.
	controller_cycles_ += 800000 * half_cycles.as_integral();
	WD::WD1770::run_for(Cycles(int(controller_cycles_ / 715909)));
	controller_cycles_ %= 715909;
}